

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

void __thiscall
google::protobuf::io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::AddAnnotation
          (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *this,size_t begin_offset,
          size_t end_offset,string *file_path,vector<int,_std::allocator<int>_> *path)

{
  GeneratedCodeInfo_Annotation *this_00;
  size_type sVar1;
  const_reference pvVar2;
  int local_3c;
  int i;
  Annotation *annotation;
  vector<int,_std::allocator<int>_> *path_local;
  string *file_path_local;
  size_t end_offset_local;
  size_t begin_offset_local;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *this_local;
  
  this_00 = GeneratedCodeInfo::add_annotation(this->annotation_proto_);
  local_3c = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(path);
    if (sVar1 <= (ulong)(long)local_3c) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](path,(long)local_3c);
    GeneratedCodeInfo_Annotation::add_path(this_00,*pvVar2);
    local_3c = local_3c + 1;
  }
  GeneratedCodeInfo_Annotation::set_source_file(this_00,file_path);
  GeneratedCodeInfo_Annotation::set_begin(this_00,(int32)begin_offset);
  GeneratedCodeInfo_Annotation::set_end(this_00,(int32)end_offset);
  return;
}

Assistant:

virtual void AddAnnotation(size_t begin_offset, size_t end_offset,
                             const string& file_path,
                             const std::vector<int>& path) {
    typename AnnotationProto::Annotation* annotation =
        annotation_proto_->add_annotation();
    for (int i = 0; i < path.size(); ++i) {
      annotation->add_path(path[i]);
    }
    annotation->set_source_file(file_path);
    annotation->set_begin(begin_offset);
    annotation->set_end(end_offset);
  }